

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_rem_intra_pred_mode(bitstream *str,h264_cabac_context *cabac,uint32_t *val)

{
  int iVar1;
  h264_cabac_context *in_RDX;
  bitstream *in_RSI;
  int *in_RDI;
  int i;
  uint32_t bit [3];
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  uint in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RSI == (bitstream *)0x0) {
    local_4 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  }
  else {
    for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
      *(uint *)(&stack0xffffffffffffffd4 + (long)iVar2 * 4) =
           *(uint *)&in_RDX->slice >> ((byte)iVar2 & 0x1f) & 1;
      iVar1 = h264_cabac_decision(in_RSI,in_RDX,in_stack_ffffffffffffffdc,
                                  (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,iVar2));
      if (iVar1 != 0) {
        return 1;
      }
    }
    if (*in_RDI == 1) {
      *(uint *)&in_RDX->slice =
           in_stack_ffffffffffffffd4 | in_stack_ffffffffffffffd8 << 1 |
           in_stack_ffffffffffffffdc << 2;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int h264_rem_intra_pred_mode(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *val) {
	if (!cabac)
		return vs_u(str, val, 3);
	uint32_t bit[3];
	int i;
	for (i = 0; i < 3; i++) {
		bit[i] = *val >> i & 1;
		if (h264_cabac_decision(str, cabac, H264_CABAC_CTXIDX_REM_INTRA_PRED_MODE, &bit[i])) return 1;
	}
	if (str->dir == VS_DECODE) {
		*val = bit[0] | bit[1] << 1 | bit[2] << 2;
	}
	return 0;
}